

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkheader.c
# Opt level: O1

ktx_error_code_e ktxCheckHeader1_(KTX_header *pHeader,KTX_supplemental_info *pSuppInfo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if ((pHeader == (KTX_header *)0x0) || (pSuppInfo == (KTX_supplemental_info *)0x0)) {
    __assert_fail("pHeader != NULL && pSuppInfo != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/checkheader.c"
                  ,0x3a,"ktx_error_code_e ktxCheckHeader1_(KTX_header *, KTX_supplemental_info *)");
  }
  if (*(int *)(pHeader->identifier + 8) != 0xa1a0a0d ||
      *(long *)pHeader->identifier != -0x44cecedfa7abb455) {
    return KTX_UNKNOWN_FILE_FORMAT;
  }
  if (pHeader->endianness != 0x4030201) {
    if (pHeader->endianness != 0x1020304) {
      return KTX_FILE_DATA_ERROR;
    }
    _ktxSwapEndian32(&pHeader->glType,0xc);
    if (4 < pHeader->glTypeSize) {
      return KTX_FILE_DATA_ERROR;
    }
    if ((0x16U >> (pHeader->glTypeSize & 0x1f) & 1) == 0) {
      return KTX_FILE_DATA_ERROR;
    }
  }
  pSuppInfo->compressed = '\0';
  if ((pHeader->glType == 0) || (pHeader->glFormat == 0)) {
    if (pHeader->glType + pHeader->glFormat != 0) {
      return KTX_FILE_DATA_ERROR;
    }
    pSuppInfo->compressed = '\x01';
  }
  if (pHeader->glFormat == pHeader->glInternalformat) {
    return KTX_FILE_DATA_ERROR;
  }
  uVar1 = pHeader->pixelWidth;
  if (uVar1 == 0) {
    return KTX_FILE_DATA_ERROR;
  }
  uVar2 = pHeader->pixelDepth;
  if (uVar2 != 0) {
    if (pHeader->pixelHeight == 0) {
      return KTX_FILE_DATA_ERROR;
    }
    if (uVar2 != 0) {
      if (pHeader->numberOfArrayElements != 0) {
        return KTX_UNSUPPORTED_FEATURE;
      }
      pSuppInfo->textureDimension = 3;
      goto LAB_001cdcb6;
    }
  }
  if (pHeader->pixelHeight == 0) {
    pSuppInfo->textureDimension = 1;
  }
  else {
    pSuppInfo->textureDimension = 2;
  }
LAB_001cdcb6:
  if (pHeader->numberOfFaces != 1) {
    if (pHeader->numberOfFaces != 6) {
      return KTX_FILE_DATA_ERROR;
    }
    if (pSuppInfo->textureDimension != 2) {
      return KTX_FILE_DATA_ERROR;
    }
  }
  if (pHeader->numberOfMipLevels == 0) {
    pSuppInfo->generateMipmaps = '\x01';
    pHeader->numberOfMipLevels = 1;
  }
  else {
    pSuppInfo->generateMipmaps = '\0';
  }
  uVar3 = pHeader->pixelHeight;
  if (pHeader->pixelHeight < uVar1) {
    uVar3 = uVar1;
  }
  if (uVar3 <= uVar2) {
    uVar3 = uVar2;
  }
  return (uint)(uVar3 >> ((char)pHeader->numberOfMipLevels - 1U & 0x1f) == 0);
}

Assistant:

KTX_error_code  ktxCheckHeader1_(KTX_header* pHeader,
                                 KTX_supplemental_info* pSuppInfo)
{
    ktx_uint8_t identifier_reference[12] = KTX_IDENTIFIER_REF;
    ktx_uint32_t max_dim;

    assert(pHeader != NULL && pSuppInfo != NULL);

    /* Compare identifier, is this a KTX file? */
    if (memcmp(pHeader->identifier, identifier_reference, 12) != 0)
    {
        return KTX_UNKNOWN_FILE_FORMAT;
    }

    if (pHeader->endianness == KTX_ENDIAN_REF_REV)
    {
        /* Convert endianness of pHeader fields. */
        _ktxSwapEndian32(&pHeader->glType, 12);

        if (pHeader->glTypeSize != 1 &&
            pHeader->glTypeSize != 2 &&
            pHeader->glTypeSize != 4)
        {
            /* Only 8-, 16-, and 32-bit types supported so far. */
            return KTX_FILE_DATA_ERROR;
        }
    }
    else if (pHeader->endianness != KTX_ENDIAN_REF)
    {
        return KTX_FILE_DATA_ERROR;
    }

    /* Check glType and glFormat */
    pSuppInfo->compressed = 0;
    if (pHeader->glType == 0 || pHeader->glFormat == 0)
    {
        if (pHeader->glType + pHeader->glFormat != 0)
        {
            /* either both or none of glType, glFormat must be zero */
            return KTX_FILE_DATA_ERROR;
        }
        pSuppInfo->compressed = 1;
    }

    if (pHeader->glFormat == pHeader->glInternalformat) {
        // glInternalFormat is either unsized (which is no longer and should
        // never have been supported by libktx) or glFormat is sized.
        return KTX_FILE_DATA_ERROR;
    }

    /* Check texture dimensions. KTX files can store 8 types of textures:
       1D, 2D, 3D, cube, and array variants of these. There is currently
       no GL extension for 3D array textures. */
    if ((pHeader->pixelWidth == 0) ||
        (pHeader->pixelDepth > 0 && pHeader->pixelHeight == 0))
    {
        /* texture must have width */
        /* texture must have height if it has depth */
        return KTX_FILE_DATA_ERROR;
    }


    if (pHeader->pixelDepth > 0)
    {
        if (pHeader->numberOfArrayElements > 0)
        {
            /* No 3D array textures yet. */
            return KTX_UNSUPPORTED_FEATURE;
        }
        pSuppInfo->textureDimension = 3;
    }
    else if (pHeader->pixelHeight > 0)
    {
        pSuppInfo->textureDimension = 2;
    }
    else
    {
        pSuppInfo->textureDimension = 1;
    }

    if (pHeader->numberOfFaces == 6)
    {
        if (pSuppInfo->textureDimension != 2)
        {
            /* cube map needs 2D faces */
            return KTX_FILE_DATA_ERROR;
        }
    }
    else if (pHeader->numberOfFaces != 1)
    {
        /* numberOfFaces must be either 1 or 6 */
        return KTX_FILE_DATA_ERROR;
    }

    /* Check number of mipmap levels */
    if (pHeader->numberOfMipLevels == 0)
    {
        pSuppInfo->generateMipmaps = 1;
        pHeader->numberOfMipLevels = 1;
    }
    else
    {
        pSuppInfo->generateMipmaps = 0;
    }

    /* This test works for arrays too because height or depth will be 0. */
    max_dim = MAX(MAX(pHeader->pixelWidth, pHeader->pixelHeight), pHeader->pixelDepth);
    if (max_dim < ((ktx_uint32_t)1 << (pHeader->numberOfMipLevels - 1)))
    {
        /* Can't have more mip levels than 1 + log2(max(width, height, depth)) */
        return KTX_FILE_DATA_ERROR;
    }

    return KTX_SUCCESS;
}